

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

uint add_list_to_class(uint8_t *classbits,PCRE2_UCHAR8 **uchardptr,uint32_t options,
                      uint32_t xoptions,compile_block_8 *cb,uint32_t *p,uint except)

{
  undefined4 uVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  uint *puVar4;
  int iVar5;
  undefined4 in_register_00000014;
  uint uVar6;
  uint uVar7;
  uint32_t start;
  ulong uVar8;
  
  start = (uint32_t)p;
  puVar4 = (uint *)CONCAT44(in_register_0000000c,xoptions);
  uVar2 = *puVar4;
  uVar3 = (ulong)uVar2;
  uVar8 = uVar3;
  if (uVar2 != 0xffffffff) {
    do {
      uVar1 = (undefined4)uVar3;
      iVar5 = 1;
      uVar2 = 1;
      do {
        uVar6 = uVar2;
        iVar5 = iVar5 + -1;
        uVar7 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar7;
        uVar2 = uVar6 + 1;
      } while (uVar7 == puVar4[uVar6]);
      *(undefined4 *)(CONCAT44(in_register_00000014,options) + 0x100) = uVar1;
      uVar2 = puVar4[(uint)-iVar5];
      *(uint *)(CONCAT44(in_register_00000014,options) + 0x104) = uVar2;
      add_to_class_internal
                (classbits,(PCRE2_UCHAR8 **)((ulong)uchardptr & 0xffffffff),options,*puVar4,
                 (compile_block_8 *)(ulong)uVar2,start,(uint32_t)uVar8);
      uVar2 = puVar4[uVar6];
      uVar3 = (ulong)uVar2;
      puVar4 = puVar4 + uVar6;
    } while (uVar2 != 0xffffffff);
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

static unsigned int
add_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr, uint32_t options,
  uint32_t xoptions, compile_block *cb, const uint32_t *p, unsigned int except)
{
unsigned int n8 = 0;
while (p[0] < NOTACHAR)
  {
  unsigned int n = 0;
  if (p[0] != except)
    {
    while(p[n+1] == p[0] + n + 1) n++;
    cb->class_range_start = p[0];
    cb->class_range_end = p[n];
    n8 += add_to_class_internal(classbits, uchardptr, options, xoptions, cb,
      p[0], p[n]);
    }
  p += n + 1;
  }
return n8;
}